

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int calc_cookie_signature
              (ptls_t *tls,ptls_handshake_properties_t *properties,
              ptls_key_exchange_algorithm_t *negotiated_group,ptls_iovec_t tbs,uint8_t *sig)

{
  ptls_hash_context_t *ppVar1;
  void *in_RCX;
  undefined2 *in_RDX;
  long in_RSI;
  long in_RDI;
  ulong in_R8;
  void *in_R9;
  uint8_t len8_3;
  size_t len_3;
  uint8_t len8_2;
  size_t len_2;
  uint8_t b_1 [2];
  uint16_t v_1;
  uint8_t b [2];
  uint16_t v;
  uint8_t len8_1;
  size_t len_1;
  uint8_t len8;
  size_t len;
  ptls_hash_context_t *hctx;
  ptls_hash_algorithm_t *algo;
  ulong local_98;
  undefined1 local_89;
  size_t local_88;
  undefined1 local_79;
  ulong local_78;
  undefined1 local_6a;
  undefined1 local_69;
  undefined2 local_68;
  undefined1 local_66;
  undefined1 local_65;
  undefined2 local_64;
  undefined1 local_61;
  ulong local_60;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  void *in_stack_ffffffffffffffb0;
  size_t sVar2;
  ptls_hash_algorithm_t *in_stack_ffffffffffffffb8;
  int local_4;
  
  ppVar1 = ptls_hmac_create(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                            CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  if (ppVar1 == (ptls_hash_context_t *)0x0) {
    local_4 = 0x201;
  }
  else {
    sVar2 = 0x20;
    (*ppVar1->update)(ppVar1,&stack0xffffffffffffffaf,1);
    (*ppVar1->update)(ppVar1,(void *)(in_RDI + 0x128),sVar2);
    if (*(long *)(in_RDI + 0x108) == 0) {
      local_98 = 0;
    }
    else {
      local_98 = strlen(*(char **)(in_RDI + 0x108));
    }
    local_60 = local_98;
    if (0xfe < local_98) {
      __assert_fail("len < UINT8_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0xe28,
                    "int calc_cookie_signature(ptls_t *, ptls_handshake_properties_t *, ptls_key_exchange_algorithm_t *, ptls_iovec_t, uint8_t *)"
                   );
    }
    local_61 = (undefined1)local_98;
    (*ppVar1->update)(ppVar1,&local_61,1);
    (*ppVar1->update)(ppVar1,*(void **)(in_RDI + 0x108),local_60);
    local_64 = **(undefined2 **)(in_RDI + 0x120);
    local_66 = (undefined1)((ushort)local_64 >> 8);
    local_65 = (undefined1)local_64;
    (*ppVar1->update)(ppVar1,&local_66,2);
    local_68 = *in_RDX;
    local_6a = (undefined1)((ushort)local_68 >> 8);
    local_69 = (undefined1)local_68;
    (*ppVar1->update)(ppVar1,&local_6a,2);
    local_78 = *(ulong *)(in_RSI + 0x58);
    if (0xfe < local_78) {
      __assert_fail("len < UINT8_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0xe2b,
                    "int calc_cookie_signature(ptls_t *, ptls_handshake_properties_t *, ptls_key_exchange_algorithm_t *, ptls_iovec_t, uint8_t *)"
                   );
    }
    local_79 = (undefined1)local_78;
    (*ppVar1->update)(ppVar1,&local_79,1);
    (*ppVar1->update)(ppVar1,*(void **)(in_RSI + 0x50),local_78);
    if (0xfe < in_R8) {
      __assert_fail("len < UINT8_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0xe2d,
                    "int calc_cookie_signature(ptls_t *, ptls_handshake_properties_t *, ptls_key_exchange_algorithm_t *, ptls_iovec_t, uint8_t *)"
                   );
    }
    local_89 = (undefined1)in_R8;
    local_88 = in_R8;
    (*ppVar1->update)(ppVar1,&local_89,1);
    (*ppVar1->update)(ppVar1,in_RCX,local_88);
    (*ppVar1->final)(ppVar1,in_R9,PTLS_HASH_FINAL_MODE_FREE);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int calc_cookie_signature(ptls_t *tls, ptls_handshake_properties_t *properties,
                                 ptls_key_exchange_algorithm_t *negotiated_group, ptls_iovec_t tbs, uint8_t *sig)
{
    ptls_hash_algorithm_t *algo = tls->ctx->cipher_suites[0]->hash;
    ptls_hash_context_t *hctx;

    if ((hctx = ptls_hmac_create(algo, properties->server.cookie.key, algo->digest_size)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

#define UPDATE_BLOCK(p, _len)                                                                                                      \
    do {                                                                                                                           \
        size_t len = (_len);                                                                                                       \
        assert(len < UINT8_MAX);                                                                                                   \
        uint8_t len8 = (uint8_t)len;                                                                                               \
        hctx->update(hctx, &len8, 1);                                                                                              \
        hctx->update(hctx, (p), len);                                                                                              \
    } while (0)
#define UPDATE16(_v)                                                                                                               \
    do {                                                                                                                           \
        uint16_t v = (_v);                                                                                                         \
        uint8_t b[2] = {v >> 8, v & 0xff};                                                                                         \
        hctx->update(hctx, b, 2);                                                                                                  \
    } while (0)

    UPDATE_BLOCK(tls->client_random, sizeof(tls->client_random));
    UPDATE_BLOCK(tls->server_name, tls->server_name != NULL ? strlen(tls->server_name) : 0);
    UPDATE16(tls->cipher_suite->id);
    UPDATE16(negotiated_group->id);
    UPDATE_BLOCK(properties->server.cookie.additional_data.base, properties->server.cookie.additional_data.len);

    UPDATE_BLOCK(tbs.base, tbs.len);

#undef UPDATE_BLOCK
#undef UPDATE16

    hctx->final(hctx, sig, PTLS_HASH_FINAL_MODE_FREE);
    return 0;
}